

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O2

void __thiscall HBT_correlation::output_correlation_function(HBT_correlation *this)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  undefined1 auVar3 [16];
  ostream *poVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined8 local_448;
  double local_438;
  double local_430;
  undefined1 local_428 [16];
  undefined4 local_418;
  undefined4 uStack_414;
  char *local_3f8 [4];
  undefined1 local_3d8 [16];
  string local_3c8;
  ofstream output;
  undefined8 auStack_3a0 [2];
  uint auStack_390 [122];
  ostringstream filename;
  
  lVar8 = 0;
  while (lVar8 < (long)this->n_KT + -1) {
    uVar1 = (this->number_of_pairs_numerator_KTdiff).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8];
    uVar2 = (this->number_of_pairs_denormenator_KTdiff).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8];
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename);
    poVar4 = std::operator<<((ostream *)&filename,(string *)&this->path_);
    std::operator<<(poVar4,"/HBT_correlation_function_KT_");
    poVar4 = std::ostream::_M_insert<double>
                       ((this->KT_array_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar8]);
    std::operator<<(poVar4,"_");
    poVar4 = std::ostream::_M_insert<double>
                       ((this->KT_array_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar8 + 1]);
    std::operator<<(poVar4,".dat");
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&output,local_3f8[0],_S_out);
    local_418 = (undefined4)uVar1;
    uStack_414 = (undefined4)(uVar1 >> 0x20);
    dVar11 = (double)CONCAT44(0x45300000,uStack_414) - 1.9342813113834067e+25;
    local_448._0_4_ = (undefined4)uVar2;
    local_448._4_4_ = (undefined4)(uVar2 >> 0x20);
    local_3d8._0_8_ =
         (dVar11 + ((double)CONCAT44(0x43300000,local_418) - 4503599627370496.0)) /
         (((double)CONCAT44(0x45300000,local_448._4_4_) - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(undefined4)local_448) - 4503599627370496.0));
    local_3d8._8_8_ = dVar11;
    std::__cxx11::string::~string((string *)local_3f8);
    iVar5 = this->qnpts;
    for (lVar9 = 0; lVar9 < iVar5; lVar9 = lVar9 + 1) {
      for (lVar6 = 0; lVar6 < iVar5; lVar6 = lVar6 + 1) {
        for (lVar7 = 0; lVar7 < iVar5; lVar7 = lVar7 + 1) {
          iVar5 = (int)this->correl_3d_denorm[lVar8][lVar6][lVar7][lVar9];
          if (((int)this->correl_3d_num_count[lVar8][lVar6][lVar7][lVar9] < 2) || (iVar5 < 2)) {
            local_438 = (this->q_long).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar9];
            local_448 = (double)iVar5;
            local_428._8_8_ =
                 (this->q_side).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
            local_428._0_8_ =
                 (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar6];
            local_430 = 0.0;
          }
          else {
            dVar11 = (double)(int)this->correl_3d_num_count[lVar8][lVar6][lVar7][lVar9];
            auVar10._8_8_ = this->q_side_mean[lVar8][lVar6][lVar7][lVar9];
            auVar10._0_8_ = this->q_out_mean[lVar8][lVar6][lVar7][lVar9];
            local_438 = this->q_long_mean[lVar8][lVar6][lVar7][lVar9] / dVar11;
            auVar3._8_8_ = dVar11;
            auVar3._0_8_ = dVar11;
            local_428 = divpd(auVar10,auVar3);
            local_430 = this->correl_3d_num[lVar8][lVar6][lVar7][lVar9];
            local_448 = this->correl_3d_denorm[lVar8][lVar6][lVar7][lVar9] * (double)local_3d8._0_8_
            ;
          }
          std::__cxx11::string::string((string *)&local_3c8,"ecoOutput",(allocator *)local_3f8);
          dVar11 = ParameterReader::getVal(&this->paraRdr_,&local_3c8,0.0);
          std::__cxx11::string::~string((string *)&local_3c8);
          *(uint *)((long)auStack_390 + *(long *)(_output + -0x18)) =
               *(uint *)((long)auStack_390 + *(long *)(_output + -0x18)) & 0xfffffefb | 0x100;
          *(undefined8 *)((long)auStack_3a0 + *(long *)(_output + -0x18) + 8) = 0x12;
          *(undefined8 *)((long)auStack_3a0 + *(long *)(_output + -0x18)) = 8;
          if ((dVar11 != 1.0) || (NAN(dVar11))) {
            poVar4 = std::ostream::_M_insert<double>((double)local_428._0_8_);
            std::operator<<(poVar4,"    ");
            poVar4 = std::ostream::_M_insert<double>((double)local_428._8_8_);
            std::operator<<(poVar4,"    ");
            poVar4 = std::ostream::_M_insert<double>(local_438);
            std::operator<<(poVar4,"    ");
          }
          poVar4 = std::ostream::_M_insert<double>(local_430);
          std::operator<<(poVar4,"    ");
          poVar4 = std::ostream::_M_insert<double>(local_448);
          std::endl<char,std::char_traits<char>>(poVar4);
          iVar5 = this->qnpts;
        }
      }
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&output);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename);
    lVar8 = lVar8 + 1;
  }
  return;
}

Assistant:

void HBT_correlation::output_correlation_function() {
    for (int iK = 0; iK < n_KT - 1; iK++) {
        double npair_ratio =
            (static_cast<double>(number_of_pairs_numerator_KTdiff[iK])
             / static_cast<double>(number_of_pairs_denormenator_KTdiff[iK]));
        std::ostringstream filename;
        filename << path_ << "/HBT_correlation_function_KT_" << KT_array_[iK]
                 << "_" << KT_array_[iK + 1] << ".dat";
        std::ofstream output(filename.str().c_str());
        for (int iqlong = 0; iqlong < qnpts; iqlong++) {
            for (int iqout = 0; iqout < qnpts; iqout++) {
                for (int iqside = 0; iqside < qnpts; iqside++) {
                    int npart_num =
                        correl_3d_num_count[iK][iqout][iqside][iqlong];
                    int npart_denorm =
                        correl_3d_denorm[iK][iqout][iqside][iqlong];
                    double q_out_local, q_side_local, q_long_local;
                    double correl_fun_num, correl_fun_denorm;
                    if (npart_num < 2 || npart_denorm < 2) {
                        q_out_local = q_out[iqout];
                        q_side_local = q_side[iqside];
                        q_long_local = q_long[iqlong];
                        correl_fun_num = 0.0;
                        correl_fun_denorm = npart_denorm;
                    } else {
                        q_out_local =
                            (q_out_mean[iK][iqout][iqside][iqlong] / npart_num);
                        q_side_local =
                            (q_side_mean[iK][iqout][iqside][iqlong]
                             / npart_num);
                        q_long_local =
                            (q_long_mean[iK][iqout][iqside][iqlong]
                             / npart_num);

                        correl_fun_num =
                            (correl_3d_num[iK][iqout][iqside][iqlong]);
                        correl_fun_denorm =
                            (npair_ratio
                             * correl_3d_denorm[iK][iqout][iqside][iqlong]);
                    }

                    if (paraRdr_.getVal("ecoOutput", 0) == 1) {
                        output << std::scientific << std::setw(18)
                               << std::setprecision(8) << correl_fun_num
                               << "    " << correl_fun_denorm << std::endl;
                    } else {
                        output << std::scientific << std::setw(18)
                               << std::setprecision(8) << q_out_local << "    "
                               << q_side_local << "    " << q_long_local
                               << "    " << correl_fun_num << "    "
                               << correl_fun_denorm << std::endl;
                    }
                }
            }
        }
        output.close();
    }
}